

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<14,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int i;
  undefined8 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  Matrix<float,_4,_3> *mat;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Type in0;
  Vector<float,_3> res;
  float afStack_e8 [2];
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  ulong local_b8;
  undefined4 local_b0;
  float local_a8 [4];
  float local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_50 [4];
  Matrix<float,_4,_3> local_40;
  long lVar9;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar5 = &local_78;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      auVar8 = _DAT_019fcc00;
      do {
        bVar10 = SUB164(auVar8 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar4 != lVar7) {
            uVar11 = 0;
          }
          *(undefined4 *)((long)puVar5 + lVar7 + -0x10) = uVar11;
        }
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar4 + -0x10 != lVar7) {
            uVar11 = 0;
          }
          *(undefined4 *)((long)puVar5 + lVar7) = uVar11;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
      puVar5 = puVar5 + 1;
    } while (lVar6 != 4);
    local_88 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_80 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    uVar2 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78 = (undefined4)uVar1;
    uStack_74 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_70 = (undefined4)uVar2;
    uStack_6c = (undefined4)((ulong)uVar2 >> 0x20);
    local_68 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    mat = (Matrix<float,_4,_3> *)&DAT_00000004;
  }
  else {
    puVar3 = &local_88;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_88 = 0;
    uStack_80 = 0;
    puVar5 = &s_constInMat3x4;
    mat = (Matrix<float,_4,_3> *)0x0;
    do {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)puVar3 + lVar4 * 4) = *(undefined4 *)((long)puVar5 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
      mat = (Matrix<float,_4,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      puVar5 = puVar5 + 3;
    } while (mat != (Matrix<float,_4,_3> *)&DAT_00000004);
  }
  local_c0 = local_88;
  local_b8 = CONCAT44(local_b8._4_4_,(undefined4)uStack_80);
  local_e0 = CONCAT44(uStack_70,uStack_74);
  local_d8 = (float)uStack_6c;
  local_40.m_data.m_data[0].m_data[0] = 0.0;
  local_40.m_data.m_data[0].m_data[1] = 0.0;
  local_40.m_data.m_data[0].m_data[2] = 0.0;
  lVar4 = 0;
  do {
    local_40.m_data.m_data[0].m_data[lVar4] =
         *(float *)((long)&local_c0 + lVar4 * 4) + *(float *)((long)&local_e0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d0 = uStack_60;
  local_c8 = (float)(undefined4)local_68;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar4 = 0;
  do {
    local_98[lVar4] =
         local_40.m_data.m_data[0].m_data[lVar4] + *(float *)((long)&local_d0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  decrement<float,4,3>(&local_40,(MatrixCaseUtils *)&local_88,mat);
  local_e0._0_4_ = local_40.m_data.m_data[0].m_data[0];
  local_e0._4_4_ = local_40.m_data.m_data[0].m_data[1];
  local_d8 = local_40.m_data.m_data[0].m_data[2];
  local_d0._0_4_ = local_40.m_data.m_data[1].m_data[1];
  local_d0._4_4_ = local_40.m_data.m_data[1].m_data[2];
  local_c8 = local_40.m_data.m_data[1].m_data[3];
  local_c0 = 0;
  local_b8 = local_b8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_c0 + lVar4 * 4) =
         *(float *)((long)&local_e0 + lVar4 * 4) + *(float *)((long)&local_d0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_50[0] = local_40.m_data.m_data[2].m_data[2];
  local_50[1] = local_40.m_data.m_data[2].m_data[3];
  local_50[2] = local_40.m_data.m_data[2].m_data[0];
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4] = *(float *)((long)&local_c0 + lVar4 * 4) + local_50[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_e0 = 0;
  local_d8 = 0.0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_e0 + lVar4 * 4) = local_98[lVar4] + local_a8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b8 = 0x100000000;
  local_b0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_c0 + lVar4 * 4)] = afStack_e8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}